

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O0

bool __thiscall cmCPackIFWRepository::IsValid(cmCPackIFWRepository *this)

{
  byte bVar1;
  uint uVar2;
  byte local_21;
  bool local_11;
  bool valid;
  cmCPackIFWRepository *this_local;
  
  local_11 = true;
  if (this->Update < Replace) {
    bVar1 = std::__cxx11::string::empty();
    local_11 = (bool)((bVar1 ^ 0xff) & 1);
  }
  else if (this->Update == Replace) {
    uVar2 = std::__cxx11::string::empty();
    local_21 = 0;
    if ((uVar2 & 1) == 0) {
      local_21 = std::__cxx11::string::empty();
      local_21 = local_21 ^ 0xff;
    }
    local_11 = (bool)(local_21 & 1);
  }
  return local_11;
}

Assistant:

bool cmCPackIFWRepository::IsValid() const
{
  bool valid = true;

  switch (this->Update) {
    case cmCPackIFWRepository::None:
    case cmCPackIFWRepository::Add:
    case cmCPackIFWRepository::Remove:
      valid = !this->Url.empty();
      break;
    case cmCPackIFWRepository::Replace:
      valid = !this->OldUrl.empty() && !this->NewUrl.empty();
      break;
  }

  return valid;
}